

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_traps_aux(chunk *c)

{
  loc_conflict grid_00;
  trap_kind_conflict *ptVar1;
  _Bool _Var2;
  trap *trap_00;
  trap *ptVar3;
  trap_kind_conflict *ptVar4;
  trap *trap;
  loc_conflict grid;
  chunk *c_local;
  
  if ((player->is_dead & 1U) == 0) {
    rd_byte(&trf_size);
    while( true ) {
      trap_00 = (trap *)mem_zalloc(0x28);
      rd_trap(trap_00);
      grid_00 = trap_00->grid;
      _Var2 = loc_is_zero((loc)grid_00);
      if (_Var2) break;
      ptVar3 = square_trap(c,grid_00);
      trap_00->next = ptVar3;
      square_set_trap(c,grid_00,trap_00);
      ptVar1 = trap_00->kind;
      ptVar4 = lookup_trap("decoy");
      if ((ptVar1 == ptVar4) && (c == (chunk *)cave)) {
        c->decoy = grid_00;
      }
    }
    mem_free(trap_00);
  }
  return L'\0';
}

Assistant:

static int rd_traps_aux(struct chunk *c)
{
	struct loc grid;
	struct trap *trap;

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	rd_byte(&trf_size);

	/* Read traps until one has no location */
	while (true) {
		trap = mem_zalloc(sizeof(*trap));
		rd_trap(trap);
		grid = trap->grid;
		if (loc_is_zero(grid))
			break;
		else {
			/* Put the trap at the front of the grid trap list */
			trap->next = square_trap(c, grid);
			square_set_trap(c, grid, trap);

			/* Set decoy if appropriate */
			if ((trap->kind == lookup_trap("decoy")) &&
			    (c == cave)) {
				c->decoy = grid;
			}
		}
	}

	mem_free(trap);
	return 0;
}